

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

string * pfederc::logCreateErrorMessage
                   (string *__return_storage_ptr__,Lexer *lexer,Position *pos,string *msg)

{
  byte bVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  char cVar5;
  undefined8 *puVar6;
  long *plVar7;
  size_t sVar8;
  ulong *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong uVar12;
  char cVar13;
  undefined8 uVar14;
  size_t i;
  ulong uVar15;
  ulong uVar16;
  string __str;
  string __str_1;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string local_100;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  undefined8 uStack_c8;
  ulong *local_c0;
  long local_b8;
  ulong local_b0;
  long lStack_a8;
  string local_a0;
  ulong local_80;
  ulong *local_78;
  uint local_70;
  undefined4 uStack_6c;
  ulong local_68 [2];
  string *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pcVar2 = (lexer->filePath)._M_dataplus._M_p;
  local_c0 = &local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar2,pcVar2 + (lexer->filePath)._M_string_length);
  std::__cxx11::string::append((char *)&local_c0);
  uVar12 = pos->line + 1;
  cVar13 = '\x01';
  if (9 < uVar12) {
    uVar15 = uVar12;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar15 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00108261;
      }
      if (uVar15 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00108261;
      }
      if (uVar15 < 10000) goto LAB_00108261;
      bVar3 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_00108261:
  local_120 = &local_110;
  std::__cxx11::string::_M_construct((ulong)&local_120,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_120,(uint)local_118,uVar12);
  uVar12 = 0xf;
  if (local_c0 != &local_b0) {
    uVar12 = local_b0;
  }
  if (uVar12 < (ulong)(local_118 + local_b8)) {
    uVar12 = 0xf;
    if (local_120 != &local_110) {
      uVar12 = local_110;
    }
    if (uVar12 < (ulong)(local_118 + local_b8)) goto LAB_001082ce;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_c0);
  }
  else {
LAB_001082ce:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_c0,(ulong)local_120);
  }
  local_e0 = &local_d0;
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_d0 = *puVar9;
    uStack_c8 = puVar6[3];
  }
  else {
    local_d0 = *puVar9;
    local_e0 = (ulong *)*puVar6;
  }
  local_d8 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)puVar9 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_e0);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar9) {
    local_a0.field_2._M_allocated_capacity = *puVar9;
    local_a0.field_2._8_8_ = plVar7[3];
  }
  else {
    local_a0.field_2._M_allocated_capacity = *puVar9;
    local_a0._M_dataplus._M_p = (pointer)*plVar7;
  }
  local_a0._M_string_length = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  uVar12 = (pos->startIndex -
           (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[pos->line]) + 1;
  cVar13 = '\x01';
  if (9 < uVar12) {
    uVar15 = uVar12;
    cVar5 = '\x04';
    do {
      cVar13 = cVar5;
      if (uVar15 < 100) {
        cVar13 = cVar13 + -2;
        goto LAB_00108401;
      }
      if (uVar15 < 1000) {
        cVar13 = cVar13 + -1;
        goto LAB_00108401;
      }
      if (uVar15 < 10000) goto LAB_00108401;
      bVar3 = 99999 < uVar15;
      uVar15 = uVar15 / 10000;
      cVar5 = cVar13 + '\x04';
    } while (bVar3);
    cVar13 = cVar13 + '\x01';
  }
LAB_00108401:
  local_78 = local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,cVar13);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_78,local_70,uVar12);
  uVar12 = CONCAT44(uStack_6c,local_70) + local_a0._M_string_length;
  uVar14 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    uVar14 = local_a0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar14 < uVar12) {
    uVar15 = 0xf;
    if (local_78 != local_68) {
      uVar15 = local_68[0];
    }
    if (uVar15 < uVar12) goto LAB_0010848f;
    puVar6 = (undefined8 *)
             std::__cxx11::string::replace
                       ((ulong)&local_78,0,(char *)0x0,(ulong)local_a0._M_dataplus._M_p);
  }
  else {
LAB_0010848f:
    puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_78);
  }
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  psVar11 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar11) {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100.field_2._8_8_ = puVar6[3];
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar11;
    local_100._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_100._M_string_length = puVar6[1];
  *puVar6 = psVar11;
  puVar6[1] = 0;
  *(undefined1 *)psVar11 = 0;
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_50 = &local_40;
  plVar10 = plVar7 + 2;
  if ((long *)*plVar7 == plVar10) {
    local_40 = *plVar10;
    lStack_38 = plVar7[3];
  }
  else {
    local_40 = *plVar10;
    local_50 = (long *)*plVar7;
  }
  local_48 = plVar7[1];
  *plVar7 = (long)plVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  if (local_78 != local_68) {
    operator_delete(local_78,local_68[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_50,(ulong)(msg->_M_dataplus)._M_p)
  ;
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_b0 = *puVar9;
    lStack_a8 = plVar7[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar9;
    local_c0 = (ulong *)*plVar7;
  }
  local_b8 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
  puVar9 = puVar6 + 2;
  if ((ulong *)*puVar6 == puVar9) {
    local_d0 = *puVar9;
    uStack_c8 = puVar6[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar9;
    local_e0 = (ulong *)*puVar6;
  }
  local_d8 = puVar6[1];
  *puVar6 = puVar9;
  puVar6[1] = 0;
  *(undefined1 *)(puVar6 + 2) = 0;
  Lexer::getLineAt_abi_cxx11_(&local_100,lexer,pos->line);
  plVar7 = (long *)std::__cxx11::string::_M_replace_aux
                             ((ulong)&local_100,local_100._M_string_length,0,'\x01');
  puVar9 = (ulong *)(plVar7 + 2);
  if ((ulong *)*plVar7 == puVar9) {
    local_110 = *puVar9;
    lStack_108 = plVar7[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar9;
    local_120 = (ulong *)*plVar7;
  }
  local_118 = plVar7[1];
  *plVar7 = (long)puVar9;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  local_58 = __return_storage_ptr__;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  sVar8 = Lexer::getLineNumber(lexer,pos->startIndex);
  uVar12 = (lexer->lineIndices).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start[sVar8];
  Lexer::getLineNumber(lexer,pos->endIndex);
  sVar8 = pos->endIndex;
  local_80 = pos->startIndex;
  if (pos->startIndex <= sVar8) {
    local_80 = sVar8;
  }
  sVar8 = Lexer::getLineNumber(lexer,sVar8);
  uVar15 = pos->line;
  if (uVar15 < sVar8) {
    do {
      Lexer::getLineAt_abi_cxx11_(&local_a0,lexer,uVar15);
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_replace_aux
                         ((ulong)&local_a0,local_a0._M_string_length,0,'\x01');
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      psVar11 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_100.field_2._M_allocated_capacity = *psVar11;
        local_100.field_2._8_8_ = puVar6[3];
      }
      else {
        local_100.field_2._M_allocated_capacity = *psVar11;
        local_100._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_100._M_string_length = puVar6[1];
      *puVar6 = psVar11;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_120,(ulong)local_100._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 <= sVar8);
  }
  uVar15 = pos->startIndex;
  if ((uVar12 < uVar15) && (uVar12 < (lexer->fileContent)._M_string_length)) {
    do {
      uVar16 = uVar12 + 1;
      bVar1 = (lexer->fileContent)._M_dataplus._M_p[uVar12];
      if (bVar1 == 9) {
        std::__cxx11::string::append((char *)&local_120);
      }
      else if (-0x11 < (char)bVar1 || (bVar1 & 0xd0) == 0xc0) {
        std::__cxx11::string::push_back((char)&local_120);
      }
      uVar15 = pos->startIndex;
    } while ((uVar16 < uVar15) && (uVar12 = uVar16, uVar16 < (lexer->fileContent)._M_string_length))
    ;
  }
  if (uVar15 <= local_80) {
    do {
      uVar12 = (lexer->fileContent)._M_string_length;
      if (uVar12 < uVar15) break;
      if (uVar15 == uVar12) {
LAB_0010891d:
        std::__cxx11::string::push_back((char)&local_120);
      }
      else {
        bVar1 = (lexer->fileContent)._M_dataplus._M_p[uVar15];
        if (bVar1 == 9) {
          std::__cxx11::string::append((char *)&local_120);
        }
        else if (-0x11 < (char)bVar1 || (bVar1 & 0xd0) == 0xc0) goto LAB_0010891d;
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 <= local_80);
  }
  psVar4 = local_58;
  uVar12 = 0xf;
  if (local_e0 != &local_d0) {
    uVar12 = local_d0;
  }
  if (uVar12 < (ulong)(local_118 + local_d8)) {
    uVar12 = 0xf;
    if (local_120 != &local_110) {
      uVar12 = local_110;
    }
    if ((ulong)(local_118 + local_d8) <= uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_e0);
      goto LAB_001089cd;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_120);
LAB_001089cd:
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar11 = puVar6 + 2;
  if ((size_type *)*puVar6 == psVar11) {
    uVar14 = puVar6[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar11;
    *(undefined8 *)((long)&psVar4->field_2 + 8) = uVar14;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*puVar6;
    (psVar4->field_2)._M_allocated_capacity = *psVar11;
  }
  psVar4->_M_string_length = puVar6[1];
  *puVar6 = psVar11;
  puVar6[1] = 0;
  *(undefined1 *)psVar11 = 0;
  if (local_120 != &local_110) {
    operator_delete(local_120,local_110 + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,local_d0 + 1);
  }
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if (local_50 != &local_40) {
    operator_delete(local_50,local_40 + 1);
  }
  return psVar4;
}

Assistant:

std::string pfederc::logCreateErrorMessage(const Lexer &lexer, const Position &pos, const std::string &msg) noexcept {
  return _logLexerErrorBase(lexer, pos) + msg + "\n" + _logLexerErrorMark(lexer, pos);
}